

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O3

bool charmap_HasChar(char *input)

{
  Charmap *pCVar1;
  Charmap *pCVar2;
  char cVar3;
  char *pcVar4;
  
  pCVar1 = *currentCharmap + 1;
  cVar3 = *input;
  pCVar2 = pCVar1;
  if (cVar3 != '\0') {
    pcVar4 = input + 1;
    do {
      if ((&pCVar2->name)[cVar3] == (char *)0x0) {
        return false;
      }
      pCVar2 = (Charmap *)((long)(&pCVar2->name)[cVar3] * 0x800 + (long)pCVar1);
      cVar3 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar3 != '\0');
  }
  return (bool)*(undefined1 *)&pCVar2->name;
}

Assistant:

bool charmap_HasChar(char const *input)
{
	struct Charmap const *charmap = *currentCharmap;
	struct Charnode const *node = &charmap->nodes[0];

	for (; *input; input++) {
		size_t next = node->next[*input - 1];

		if (!next)
			return false;
		node = &charmap->nodes[next];
	}

	return node->isTerminal;
}